

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

Tim_Man_t * Tim_ManTrim(Tim_Man_t *p,Vec_Int_t *vBoxPres)

{
  float fVar1;
  uint uVar2;
  Tim_Obj_t *pTVar3;
  Tim_Obj_t *pTVar4;
  float *pfVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Tim_Man_t *pTVar13;
  Vec_Ptr_t *pVVar14;
  void **ppvVar15;
  float *pfVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  
  pVVar14 = p->vBoxes;
  if (pVVar14 == (Vec_Ptr_t *)0x0) {
    iVar8 = 0;
  }
  else {
    iVar8 = pVVar14->nSize;
  }
  if (vBoxPres->nSize != iVar8) {
    __assert_fail("Vec_IntSize(vBoxPres) == Tim_ManBoxNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                  ,0xad,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  if ((pVVar14 == (Vec_Ptr_t *)0x0) || (pVVar14->nSize == 0)) {
    uVar7 = p->nCis;
  }
  else {
    uVar7 = Tim_ManBoxOutputFirst(p,0);
  }
  iVar8 = Tim_ManPoNum(p);
  pVVar14 = p->vBoxes;
  if ((pVVar14 != (Vec_Ptr_t *)0x0) && (pVVar14->nSize != 0)) {
    iVar9 = pVVar14->nSize;
    if (0 < (long)iVar9) {
      lVar19 = 0;
      uVar17 = vBoxPres->nSize;
      if (vBoxPres->nSize < 1) {
        uVar17 = 0;
      }
      do {
        if (uVar17 <= iVar9 - 1U) goto LAB_00432342;
        if (vBoxPres->pArray[lVar19] != 0) {
          uVar7 = uVar7 + *(int *)((long)pVVar14->pArray[lVar19] + 0xc);
          iVar8 = iVar8 + *(int *)((long)pVVar14->pArray[lVar19] + 8);
        }
        lVar19 = lVar19 + 1;
      } while (iVar9 != lVar19);
    }
  }
  uVar17 = p->nCis;
  if ((uVar7 == uVar17) && (iVar8 == p->nCos)) {
    pTVar13 = Tim_ManDup(p,0);
    return pTVar13;
  }
  if ((int)uVar17 <= (int)uVar7) {
    __assert_fail("nNewCis < Tim_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                  ,0xba,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  uVar2 = p->nCos;
  if ((int)uVar2 <= iVar8) {
    __assert_fail("nNewCos < Tim_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                  ,0xbb,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  if ((0 < (int)uVar17) && (pTVar3 = p->pCis, pTVar3 != (Tim_Obj_t *)0x0)) {
    lVar19 = 0;
    do {
      *(undefined4 *)((long)&pTVar3->TravId + lVar19) = 0;
      lVar19 = lVar19 + 0x18;
    } while ((ulong)uVar17 * 0x18 != lVar19);
  }
  if ((0 < (int)uVar2) && (pTVar3 = p->pCos, pTVar3 != (Tim_Obj_t *)0x0)) {
    lVar19 = 0;
    do {
      *(undefined4 *)((long)&pTVar3->TravId + lVar19) = 0;
      lVar19 = lVar19 + 0x18;
    } while ((ulong)uVar2 * 0x18 != lVar19);
  }
  pTVar13 = Tim_ManStart(uVar7,iVar8);
  pTVar3 = pTVar13->pCis;
  pTVar4 = p->pCis;
  if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
    iVar9 = p->nCis;
  }
  else {
    iVar9 = Tim_ManBoxOutputFirst(p,0);
  }
  memcpy(pTVar3,pTVar4,(long)iVar9 * 0x18);
  pTVar3 = pTVar13->pCos;
  iVar10 = Tim_ManPoNum(p);
  iVar9 = p->nCos;
  pTVar4 = p->pCos;
  iVar11 = Tim_ManPoNum(p);
  iVar12 = Tim_ManPoNum(p);
  memcpy(pTVar3 + ((long)iVar8 - (long)iVar10),pTVar4 + ((long)iVar9 - (long)iVar11),
         (long)iVar12 * 0x18);
  pVVar14 = p->vDelayTables;
  if ((pVVar14 != (Vec_Ptr_t *)0x0) && (0 < pVVar14->nSize)) {
    iVar8 = pVVar14->nSize;
    pVVar14 = (Vec_Ptr_t *)malloc(0x10);
    iVar9 = 8;
    if (6 < iVar8 - 1U) {
      iVar9 = iVar8;
    }
    pVVar14->nSize = 0;
    pVVar14->nCap = iVar9;
    if (iVar9 == 0) {
      ppvVar15 = (void **)0x0;
    }
    else {
      ppvVar15 = (void **)malloc((long)iVar9 << 3);
    }
    pVVar14->pArray = ppvVar15;
    pVVar14->nSize = iVar8;
    memset(ppvVar15,0,(long)iVar8 << 3);
    pTVar13->vDelayTables = pVVar14;
    pVVar14 = p->vDelayTables;
    if (0 < pVVar14->nSize) {
      uVar20 = 0;
      do {
        pfVar5 = (float *)pVVar14->pArray[uVar20];
        if (pfVar5 != (float *)0x0) {
          fVar1 = *pfVar5;
          if (uVar20 != (uint)(int)fVar1) {
            __assert_fail("i == (int)pDelayTable[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                          ,0xd0,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
          }
          uVar7 = (int)pfVar5[2] * (int)pfVar5[1];
          pfVar16 = (float *)malloc((long)(int)uVar7 * 4 + 0xc);
          *pfVar16 = (float)(int)fVar1;
          pfVar16[1] = (float)(int)pfVar5[1];
          pfVar16[2] = (float)(int)pfVar5[2];
          if (0 < (int)uVar7) {
            uVar18 = 0;
            do {
              pfVar16[uVar18 + 3] = pfVar5[uVar18 + 3];
              uVar18 = uVar18 + 1;
            } while (uVar7 != uVar18);
          }
          if ((long)pTVar13->vDelayTables->nSize <= (long)uVar20) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar15 = pTVar13->vDelayTables->pArray;
          if (ppvVar15[uVar20] != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                          ,0xda,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
          }
          ppvVar15[uVar20] = pfVar16;
        }
        uVar20 = uVar20 + 1;
        pVVar14 = p->vDelayTables;
      } while ((long)uVar20 < (long)pVVar14->nSize);
    }
  }
  pVVar14 = p->vBoxes;
  if ((pVVar14 != (Vec_Ptr_t *)0x0) && (0 < pVVar14->nSize)) {
    if ((pVVar14 == (Vec_Ptr_t *)0x0) || (pVVar14->nSize == 0)) {
      iVar8 = p->nCis;
    }
    else {
      iVar8 = Tim_ManBoxOutputFirst(p,0);
    }
    if (p->vBoxes == (Vec_Ptr_t *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = p->vBoxes->nSize;
    }
    pVVar14 = (Vec_Ptr_t *)malloc(0x10);
    iVar10 = 8;
    if (6 < iVar9 - 1U) {
      iVar10 = iVar9;
    }
    pVVar14->nSize = 0;
    pVVar14->nCap = iVar10;
    iVar9 = 0;
    if (iVar10 == 0) {
      ppvVar15 = (void **)0x0;
    }
    else {
      ppvVar15 = (void **)malloc((long)iVar10 << 3);
    }
    pVVar14->pArray = ppvVar15;
    pTVar13->vBoxes = pVVar14;
    pVVar14 = p->vBoxes;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      iVar9 = 0;
      do {
        if (vBoxPres->nSize <= lVar19) {
LAB_00432342:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (vBoxPres->pArray[lVar19] != 0) {
          pvVar6 = pVVar14->pArray[lVar19];
          Tim_ManCreateBox(pTVar13,iVar9,*(int *)((long)pvVar6 + 8),iVar8,
                           *(int *)((long)pvVar6 + 0xc),*(int *)((long)pvVar6 + 0x10),
                           *(int *)((long)pvVar6 + 0x18));
          if (pTVar13->vBoxes == (Vec_Ptr_t *)0x0) {
            iVar10 = -1;
          }
          else {
            iVar10 = pTVar13->vBoxes->nSize + -1;
          }
          iVar12 = (int)lVar19;
          iVar11 = Tim_ManBoxCopy(p,iVar12);
          if (iVar11 != -1) {
            iVar12 = Tim_ManBoxCopy(p,iVar12);
          }
          Tim_ManBoxSetCopy(pTVar13,iVar10,iVar12);
          iVar8 = iVar8 + *(int *)((long)pvVar6 + 0xc);
          iVar9 = iVar9 + *(int *)((long)pvVar6 + 8);
        }
        lVar19 = lVar19 + 1;
        pVVar14 = p->vBoxes;
      } while (lVar19 < pVVar14->nSize);
    }
    iVar10 = Tim_ManPoNum(p);
    if (iVar8 != pTVar13->nCis) {
      __assert_fail("curPi == Tim_ManCiNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                    ,0xed,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
    if (iVar10 + iVar9 != pTVar13->nCos) {
      __assert_fail("curPo == Tim_ManCoNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                    ,0xee,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
  }
  return pTVar13;
}

Assistant:

Tim_Man_t * Tim_ManTrim( Tim_Man_t * p, Vec_Int_t * vBoxPres )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, nNewCis, nNewCos, nInputs, nOutputs;
    assert( Vec_IntSize(vBoxPres) == Tim_ManBoxNum(p) );
    // count the number of CIs and COs in the trimmed manager
    nNewCis = Tim_ManPiNum(p);
    nNewCos = Tim_ManPoNum(p);
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
            if ( Vec_IntEntry(vBoxPres, i) )
            {
                nNewCis += pBox->nOutputs;
                nNewCos += pBox->nInputs;
            }
    if ( nNewCis == Tim_ManCiNum(p) && nNewCos == Tim_ManCoNum(p) )
        return Tim_ManDup( p, 0 );
    assert( nNewCis < Tim_ManCiNum(p) );
    assert( nNewCos < Tim_ManCoNum(p) );
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( nNewCis, nNewCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * Tim_ManPiNum(p) );
    memcpy( pNew->pCos + nNewCos - Tim_ManPoNum(p), 
            p->pCos + Tim_ManCoNum(p) - Tim_ManPoNum(p), 
            sizeof(Tim_Obj_t) * Tim_ManPoNum(p) );
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = (int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                pDelayTableNew[3+k] = pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        int curPi = Tim_ManPiNum(p);
        int curPo = 0;
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Tim_ManForEachBox( p, pBox, i )
            if ( Vec_IntEntry(vBoxPres, i) )
            {
                Tim_ManCreateBox( pNew, curPo, pBox->nInputs, curPi, pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
                Tim_ManBoxSetCopy( pNew, Tim_ManBoxNum(pNew) - 1, Tim_ManBoxCopy(p, i) == -1 ? i : Tim_ManBoxCopy(p, i) );
                curPi += pBox->nOutputs;
                curPo += pBox->nInputs;
            }
        curPo += Tim_ManPoNum(p);
        assert( curPi == Tim_ManCiNum(pNew) );
        assert( curPo == Tim_ManCoNum(pNew) );
    }
    return pNew;
}